

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_horz_only_frame_superres_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_1f38a46::HighBDConvolveHorizRSTest_Correctness_Test::TestBody
          (HighBDConvolveHorizRSTest_Correctness_Test *this)

{
  byte bVar1;
  byte bVar2;
  uint16_t uVar3;
  int iVar4;
  TestImage<unsigned_short> *pTVar5;
  Message *pMVar6;
  void **val2;
  ulong uVar7;
  long lVar8;
  SEARCH_METHODS *pSVar9;
  int iVar10;
  pointer puVar11;
  uint uVar12;
  long lVar13;
  pointer puVar14;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_b0;
  AssertHelper local_a8;
  uint local_a0;
  ACMRandom rnd;
  AssertionResult gtest_ar;
  int32_t tst_value;
  int32_t ref_value;
  ulong local_78;
  TestImage<unsigned_short> **local_70;
  int *local_68;
  ConvolveHorizRSTestBase<unsigned_short> *local_60;
  long local_58;
  long local_50;
  int *local_48;
  TestImage<unsigned_short> *local_40;
  int *local_38;
  
  rnd.random_.state_ = (Random)0xbaba;
  local_70 = &(this->super_HighBDConvolveHorizRSTest).super_ConvolveHorizRSTestBase<unsigned_short>.
              image_;
  uVar7 = 0;
  local_60 = (ConvolveHorizRSTestBase<unsigned_short> *)this;
  do {
    if ((int)uVar7 == 10) {
      return;
    }
    local_78 = uVar7;
    for (uVar12 = 9; uVar12 != 0x11; uVar12 = uVar12 + 1) {
      bVar1 = libaom_test::ACMRandom::Rand8(&rnd);
      bVar2 = libaom_test::ACMRandom::Rand8(&rnd);
      uVar3 = libaom_test::ACMRandom::Rand16(&rnd);
      pTVar5 = (TestImage<unsigned_short> *)operator_new(0x50);
      val2 = (void **)(ulong)uVar12;
      local_a0 = uVar12;
      TestImage<unsigned_short>::TestImage
                (pTVar5,bVar2 + 0x80,bVar1 | 0x200,uVar12,uVar3 & 0x3fff,
                 ((ConvolveHorizRSTestBase<unsigned_short> *)this)->bd_);
      *local_70 = pTVar5;
      local_b0._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      testing::internal::
      CmpHelperNE<(anonymous_namespace)::TestImage<unsigned_short>*,decltype(nullptr)>
                (&gtest_ar.success_,(char *)local_70,(TestImage<unsigned_short> **)&local_b0,val2);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&local_b0);
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl ==
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          pSVar9 = "";
        }
        else {
          pSVar9 = *(SEARCH_METHODS **)
                    gtest_ar.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_a8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/av1_horz_only_frame_superres_test.cc"
                   ,0xcd,(char *)pSVar9);
        testing::internal::AssertHelper::operator=(&local_a8,(Message *)&local_b0);
        testing::internal::AssertHelper::~AssertHelper(&local_a8);
        if (local_b0._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_b0._M_head_impl + 8))();
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar.message_);
        return;
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar.message_);
      ConvolveHorizRSTestBase<unsigned_short>::Prep
                ((ConvolveHorizRSTestBase<unsigned_short> *)this,&rnd);
      (*(((ConvolveHorizRSTestBase<unsigned_short> *)this)->super_Test)._vptr_Test[6])(this,1);
      (*(((ConvolveHorizRSTestBase<unsigned_short> *)this)->super_Test)._vptr_Test[6])(this,0);
      pTVar5 = ((ConvolveHorizRSTestBase<unsigned_short> *)this)->image_;
      iVar10 = pTVar5->h_;
      lVar8 = (long)pTVar5->dst_stride_;
      puVar11 = (pTVar5->dst_data_).
                super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                super__Vector_impl_data._M_start;
      lVar13 = (long)(pTVar5->dst_stride_ * (iVar10 + 0x40));
      iVar4 = bcmp(puVar11,puVar11 + lVar13,lVar13 * 2);
      if (iVar4 == 0) {
LAB_0073ef84:
        std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
                  (&(pTVar5->dst_data_).
                    super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>);
        std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
                  (&(pTVar5->src_data_).
                    super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>);
      }
      else {
        local_68 = &pTVar5->h_;
        local_38 = &pTVar5->superres_denom_;
        local_48 = &pTVar5->x0_;
        puVar14 = puVar11 + lVar13 + lVar8 * 0x20 + 0x20;
        local_58 = lVar8 * 2;
        puVar11 = puVar11 + lVar8 * 0x20 + 0x20;
        lVar8 = 0x20;
        local_40 = pTVar5;
        while (lVar8 < iVar10 + 0x20) {
          local_50 = lVar8;
          for (lVar13 = 0; lVar13 + 0x20 < (long)pTVar5->w_dst_ + 0x20; lVar13 = lVar13 + 1) {
            ref_value = (int32_t)puVar11[lVar13];
            tst_value = (int32_t)puVar14[lVar13];
            testing::internal::CmpHelperEQ<int,int>
                      ((internal *)&gtest_ar,"tst_value","ref_value",&tst_value,&ref_value);
            if (gtest_ar.success_ == false) {
              testing::Message::Message((Message *)&local_b0);
              std::operator<<((ostream *)(local_b0._M_head_impl + 0x10),"Error at row: ");
              std::ostream::operator<<(local_b0._M_head_impl + 0x10,(int)lVar8 + -0x20);
              std::operator<<((ostream *)(local_b0._M_head_impl + 0x10),", col: ");
              std::ostream::operator<<(local_b0._M_head_impl + 0x10,(int)lVar13);
              std::operator<<((ostream *)(local_b0._M_head_impl + 0x10),", superres_denom: ");
              pMVar6 = testing::Message::operator<<((Message *)&local_b0,local_38);
              pMVar6 = testing::Message::operator<<(pMVar6,(char (*) [11])", height: ");
              pMVar6 = testing::Message::operator<<(pMVar6,local_68);
              pMVar6 = testing::Message::operator<<(pMVar6,(char (*) [14])", src_width: ");
              pMVar6 = testing::Message::operator<<(pMVar6,&local_40->w_src_);
              pMVar6 = testing::Message::operator<<(pMVar6,(char (*) [14])", dst_width: ");
              pMVar6 = testing::Message::operator<<(pMVar6,&pTVar5->w_dst_);
              pMVar6 = testing::Message::operator<<(pMVar6,(char (*) [7])", x0: ");
              pMVar6 = testing::Message::operator<<(pMVar6,local_48);
              pSVar9 = "";
              if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )gtest_ar.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl !=
                  (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )0x0) {
                pSVar9 = *(SEARCH_METHODS **)
                          gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_a8,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/av1_horz_only_frame_superres_test.cc"
                         ,0xa2,(char *)pSVar9);
              testing::internal::AssertHelper::operator=(&local_a8,pMVar6);
              testing::internal::AssertHelper::~AssertHelper(&local_a8);
              if (local_b0._M_head_impl !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                (**(code **)(*(long *)local_b0._M_head_impl + 8))();
              }
            }
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr(&gtest_ar.message_);
          }
          iVar10 = *local_68;
          puVar14 = (pointer)((long)puVar14 + local_58);
          puVar11 = (pointer)((long)puVar11 + local_58);
          lVar8 = local_50 + 1;
        }
        pTVar5 = *local_70;
        this = (HighBDConvolveHorizRSTest_Correctness_Test *)local_60;
        if (pTVar5 != (TestImage<unsigned_short> *)0x0) goto LAB_0073ef84;
        pTVar5 = (TestImage<unsigned_short> *)0x0;
      }
      uVar7 = local_78;
      uVar12 = local_a0;
      operator_delete(pTVar5);
    }
    uVar7 = (ulong)((int)uVar7 + 1);
  } while( true );
}

Assistant:

TEST_P(HighBDConvolveHorizRSTest, Correctness) { CorrectnessTest(); }